

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall gl4cts::GLSL420Pack::Utils::texture::release(texture *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_id != 0) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,this);
    this->m_id = 0;
    if ((this->m_texture_type == TEX_BUFFER) && (this->m_buffer_id != 0)) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_buffer_id);
      this->m_buffer_id = 0;
    }
  }
  return;
}

Assistant:

void Utils::texture::release()
{
	if (0 != m_id)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteTextures(1, &m_id);
		m_id = 0;

		if ((m_texture_type == TEX_BUFFER) && (0 != m_buffer_id))
		{
			gl.deleteBuffers(1, &m_buffer_id);
			m_buffer_id = 0;
		}
	}
}